

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O2

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOverwritesExisting<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(AssignmentOverwritesExisting<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  long lVar1;
  char *message;
  Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void> gen;
  AssertHelper local_960;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_958;
  AssertionResult gtest_ar;
  undefined1 local_920 [8];
  TypeParam n;
  TypeParam m;
  
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            ((pair<const_phmap::priv::NonStandardLayout,_int> *)&n,&gen);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            ((pair<const_phmap::priv::NonStandardLayout,_int> *)
             ((long)&n.
                     super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     .sets_._M_elems[0].set_.settings_ + 8),&gen);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            ((pair<const_phmap::priv::NonStandardLayout,_int> *)
             &n.
              super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .
              super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .sets_._M_elems[1].set_.capacity_,&gen);
  gtest_ar._0_8_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_958._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_960.data_ = (AssertHelperData *)0x0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (AssertHelperData *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
              next_id<phmap::priv::StatefulTestingEqual>()::gId + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::parallel_hash_set<std::pair<phmap::priv::NonStandardLayout_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&m,(pair<const_phmap::priv::NonStandardLayout,_int> *)&n,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)
             (n.
              super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .
              super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
              .sets_._M_elems + 2),0,(hasher *)&gtest_ar,(key_equal *)&local_958,
             (allocator_type *)&local_960);
  lVar1 = 0x60;
  do {
    NonStandardLayout::~NonStandardLayout
              ((NonStandardLayout *)
               ((long)&n.
                       super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                       .
                       super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                       .sets_._M_elems[0].set_.ctrl_ + lVar1));
    lVar1 = lVar1 + -0x30;
  } while (lVar1 != -0x30);
  hash_internal::Generator<std::pair<const_phmap::priv::NonStandardLayout,_int>,_void>::operator()
            ((pair<const_phmap::priv::NonStandardLayout,_int> *)&gtest_ar,&gen);
  local_958._M_head_impl =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_960.data_ =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_920 = (undefined1  [8])0x0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (AssertHelperData *)
       ((long)&hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
               next_id<phmap::priv::StatefulTestingEqual>()::gId->type + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::parallel_hash_set<std::pair<phmap::priv::NonStandardLayout_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&n,(pair<const_phmap::priv::NonStandardLayout,_int> *)&gtest_ar,
             (pair<const_phmap::priv::NonStandardLayout,_int> *)local_920,0,(hasher *)&local_958,
             (key_equal *)&local_960,(allocator_type *)local_920);
  NonStandardLayout::~NonStandardLayout((NonStandardLayout *)&gtest_ar);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::operator=((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
               *)&n,(parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                     *)&m);
  testing::internal::
  CmpHelperEQ<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,phmap::NullMutex>,phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>,4ul,phmap::NullMutex>>
            ((internal *)&gtest_ar,"m","n",&m,&n);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_958);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_960,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1bf,message);
    testing::internal::AssertHelper::operator=(&local_960,(Message *)&local_958);
    testing::internal::AssertHelper::~AssertHelper(&local_960);
    if (local_958._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_958._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner,_16UL>
  ::~array((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner,_16UL>
            *)&n);
  std::
  array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner,_16UL>
  ::~array((array<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>::Inner,_16UL>
            *)&m);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  TypeParam m({gen(), gen(), gen()});
  TypeParam n({gen()});
  n = m;
  EXPECT_EQ(m, n);
}